

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O1

int __thiscall
QTextDocumentPrivate::remove_block
          (QTextDocumentPrivate *this,int pos,int *blockFormat,int command,Operation op)

{
  BlockMap *this_00;
  uint *puVar1;
  uint uVar2;
  quint32 qVar3;
  long lVar4;
  QTextBlockData *pQVar5;
  QTextLayout *pQVar6;
  uint uVar7;
  uint z;
  uint f;
  long *plVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  long in_FS_OFFSET;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->blocks;
  uVar7 = QFragmentMapData<QTextBlockData>::findNode(&this_00->data,pos,0);
  z = QFragmentMapData<QTextFragmentData>::findNode(&(this->fragments).data,pos,0);
  if ((command != 6) ||
     (f = uVar7, (this->blocks).data.field_0.fragments[uVar7].super_QFragment<3>.size_array[0] != 1)
     ) {
    f = QFragmentMapData<QTextBlockData>::next(&this_00->data,uVar7);
    pQVar5 = (this_00->data).field_0.fragments;
    uVar2 = pQVar5[uVar7].super_QFragment<3>.parent;
    qVar3 = pQVar5[f].super_QFragment<3>.size_array[0];
    pQVar5[uVar7].super_QFragment<3>.size_array[0] =
         (pQVar5[uVar7].super_QFragment<3>.size_array[0] + qVar3) - 1;
    if (uVar2 != 0) {
      uVar11 = uVar7;
      do {
        uVar10 = uVar2;
        puVar1 = (uint *)((long)(this_00->data).field_0.head + (ulong)uVar10 * 0x48);
        if (puVar1[1] == uVar11) {
          puVar1[4] = puVar1[4] + (qVar3 - 1);
        }
        uVar2 = *puVar1;
        uVar11 = uVar10;
      } while (*puVar1 != 0);
    }
    if ((uVar7 != 0) &&
       (pQVar6 = (this_00->data).field_0.fragments[uVar7].layout, pQVar6 != (QTextLayout *)0x0)) {
      QTextEngine::invalidate(pQVar6->d);
    }
    pQVar5 = (this_00->data).field_0.fragments;
    pQVar5[uVar7].userState = pQVar5[f].userState;
  }
  *blockFormat = (this->blocks).data.field_0.fragments[f].format;
  objectForFormat(this,(this->blocks).data.field_0.fragments[f].format);
  plVar8 = (long *)QMetaObject::cast((QObject *)&QTextBlockGroup::staticMetaObject);
  if (plVar8 != (long *)0x0) {
    (**(code **)(*plVar8 + 0x68))(plVar8);
  }
  objectForFormat(this,(this->fragments).data.field_0.fragments[z].format);
  lVar9 = QMetaObject::cast((QObject *)&QTextFrame::staticMetaObject);
  if (lVar9 != 0) {
    (**(code **)(**(long **)(lVar9 + 8) + 0x28))
              (*(long **)(lVar9 + 8),
               (this->text).d.ptr[(this->fragments).data.field_0.fragments[z].stringPosition],z);
    this->framesDirty = true;
  }
  QFragmentMap<QTextBlockData>::erase_single(this_00,f);
  uVar7 = QFragmentMapData<QTextFragmentData>::erase_single(&(this->fragments).data,z);
  adjustDocumentChangesAndCursors(this,pos,-1,op);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return uVar7;
  }
  __stack_chk_fail();
}

Assistant:

int QTextDocumentPrivate::remove_block(int pos, int *blockFormat, int command, QTextUndoCommand::Operation op)
{
    Q_ASSERT(pos >= 0);
    Q_ASSERT(blocks.length() == fragments.length());
    Q_ASSERT(blocks.length() > pos);

    int b = blocks.findNode(pos);
    uint x = fragments.findNode(pos);

    Q_ASSERT(x && (int)fragments.position(x) == pos);
    Q_ASSERT(fragments.size(x) == 1);
    Q_ASSERT(isValidBlockSeparator(text.at(fragments.fragment(x)->stringPosition)));
    Q_ASSERT(b);

    if (blocks.size(b) == 1 && command == QTextUndoCommand::BlockAdded) {
        Q_ASSERT((int)blocks.position(b) == pos);
        // qDebug("removing empty block");
        // empty block remove the block itself
    } else {
        // non empty block, merge with next one into this block
        // qDebug("merging block with next");
        int n = blocks.next(b);
        Q_ASSERT((int)blocks.position(n) == pos + 1);
        blocks.setSize(b, blocks.size(b) + blocks.size(n) - 1);
        blocks.fragment(b)->userState = blocks.fragment(n)->userState;
        b = n;
    }
    *blockFormat = blocks.fragment(b)->format;

    QTextBlockGroup *group = qobject_cast<QTextBlockGroup *>(objectForFormat(blocks.fragment(b)->format));
    if (group)
        group->blockRemoved(QTextBlock(this, b));

    QTextFrame *frame = qobject_cast<QTextFrame *>(objectForFormat(fragments.fragment(x)->format));
    if (frame) {
        frame->d_func()->fragmentRemoved(text.at(fragments.fragment(x)->stringPosition), x);
        framesDirty = true;
    }

    blocks.erase_single(b);
    const int w = fragments.erase_single(x);

    adjustDocumentChangesAndCursors(pos, -1, op);

    return w;
}